

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint64_t helper_float_floor_2008_l_d_mips(CPUMIPSState *env,uint64_t fdt0)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t unaff_retaddr;
  
  (env->active_fpu).fp_status.float_rounding_mode = '\x01';
  uVar3 = float64_to_int64_mips(fdt0,&(env->active_fpu).fp_status);
  uVar2 = (env->active_fpu).fcr31;
  (env->active_fpu).fp_status.float_rounding_mode = (char)ieee_rm_mips[uVar2 & 3];
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  if (bVar1 == 0) {
    uVar6 = uVar2 & 0xfffc0fff;
  }
  else {
    uVar5 = bVar1 >> 5 & 1 | (bVar1 >> 3 & 2 | bVar1 >> 1 & 4 | (bVar1 & 1) << 4) + (bVar1 & 4) * 2;
    uVar6 = uVar5 << 0xc | uVar2 & 0xfffc0fff;
    (env->active_fpu).fcr31 = uVar6;
    if (uVar5 == 0) goto LAB_00749415;
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar5 & uVar2 >> 7) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    uVar6 = uVar6 | uVar5 << 2;
  }
  (env->active_fpu).fcr31 = uVar6;
LAB_00749415:
  uVar4 = 0;
  if ((fdt0 & 0x7fffffffffffffff) < 0x7ff0000000000001) {
    uVar4 = uVar3;
  }
  if ((bVar1 & 1) == 0) {
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

uint64_t helper_float_floor_2008_l_d(CPUMIPSState *env, uint64_t fdt0)
{
    uint64_t dt2;

    set_float_rounding_mode(float_round_down, &env->active_fpu.fp_status);
    dt2 = float64_to_int64(fdt0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float64_is_any_nan(fdt0)) {
            dt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return dt2;
}